

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SettingsHandlerWindow_ReadLine
               (ImGuiContext *ctx,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float y;
  float x;
  int i;
  float local_24;
  float local_20;
  int local_1c;
  
  iVar3 = __isoc99_sscanf(line,"Pos=%f,%f",&local_20,&local_24);
  if (iVar3 == 2) {
    *(float *)((long)entry + 0xc) = local_20;
    *(float *)((long)entry + 0x10) = local_24;
  }
  else {
    iVar3 = __isoc99_sscanf(line,"Size=%f,%f",&local_20,&local_24);
    if (iVar3 == 2) {
      fVar1 = (ctx->Style).WindowMinSize.x;
      fVar2 = (ctx->Style).WindowMinSize.y;
      uVar4 = -(uint)(fVar1 <= local_20);
      uVar5 = -(uint)(fVar2 <= local_24);
      *(ulong *)((long)entry + 0x14) =
           CONCAT44(~uVar5 & (uint)fVar2 | (uint)local_24 & uVar5,
                    ~uVar4 & (uint)fVar1 | (uint)local_20 & uVar4);
    }
    else {
      iVar3 = __isoc99_sscanf(line,"Collapsed=%d",&local_1c);
      if (iVar3 == 1) {
        *(bool *)((long)entry + 0x1c) = local_1c != 0;
      }
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_ReadLine(ImGuiContext* ctx, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiContext& g = *ctx;
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    float x, y;
    int i;
    if (sscanf(line, "Pos=%f,%f", &x, &y) == 2)         settings->Pos = ImVec2(x, y);
    else if (sscanf(line, "Size=%f,%f", &x, &y) == 2)   settings->Size = ImMax(ImVec2(x, y), g.Style.WindowMinSize);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}